

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

void __thiscall
flatbuffers::BinaryAnnotator::BuildVector
          (BinaryAnnotator *this,uint64_t vector_offset,Object *table,Field *field,
          uint64_t parent_table_offset,
          map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          *vtable_fields)

{
  char *pcVar1;
  BinarySectionType type;
  Field *this_00;
  bool bVar2;
  uint16_t uVar3;
  BaseType BVar4;
  Optional<unsigned_short> OVar5;
  BinaryRegionType BVar6;
  Type *pTVar7;
  uint64_t uVar8;
  Optional<unsigned_int> OVar9;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_01;
  _Base_ptr this_02;
  char *pcVar10;
  String *pSVar11;
  int __c;
  int __c_00;
  int __c_01;
  uint8_t uVar12;
  char *pcVar13;
  ulong uVar14;
  unsigned_long t;
  uint64_t uVar15;
  char *offset;
  BinaryRegion *__return_storage_ptr__;
  BinaryRegionComment *pBVar16;
  Optional<unsigned_long> OVar17;
  uint16_t union_type_vector_id;
  Field *local_cb8;
  ulong local_cb0;
  _Base_ptr local_ca8;
  undefined1 local_ca0 [8];
  _Alloc_hider local_c98;
  undefined1 local_c90 [24];
  BinaryRegionCommentType local_c78;
  _Alloc_hider local_c70;
  pointer local_c68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c60;
  _Alloc_hider local_c50;
  size_type local_c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c40;
  ulong local_c30;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  _Storage<unsigned_long,_true> local_c00;
  string enum_type;
  BinaryRegion local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  long local_b08;
  uint64_t local_b00;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_af8;
  string local_ad8;
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  undefined1 local_9f8 [8];
  _Alloc_hider local_9f0;
  size_type local_9e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e0;
  BinaryRegionCommentType local_9d0;
  _Alloc_hider local_9c8;
  size_type local_9c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b8;
  _Alloc_hider local_9a8;
  size_type local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  size_t local_988;
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  BinaryRegionComment local_8a0;
  BinaryRegionComment local_828;
  BinaryRegionComment local_7b0;
  BinaryRegionComment local_738;
  BinaryRegionComment local_6c0;
  BinaryRegionComment local_648;
  BinaryRegionComment local_5d0;
  BinaryRegionComment local_558;
  BinaryRegionComment local_4e0;
  BinaryRegionComment local_468;
  BinaryRegionComment local_3f0;
  BinaryRegionComment local_378;
  BinaryRegionComment local_300;
  BinaryRegionComment local_288;
  BinaryRegionComment local_210;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  bVar2 = ContainsSection(this,vector_offset);
  if (bVar2) {
    return;
  }
  local_9f0._M_p = (pointer)&local_9e0;
  local_9f8._0_4_ = OK;
  local_9e8 = 0;
  local_9e0._M_local_buf[0] = '\0';
  local_9c8._M_p = (pointer)&local_9b8;
  local_9c0 = 0;
  local_9b8._M_local_buf[0] = '\0';
  local_9a8._M_p = (pointer)&local_998;
  local_9a0 = 0;
  local_998._M_local_buf[0] = '\0';
  local_988 = 0;
  local_9d0 = VectorLength;
  local_cb0 = parent_table_offset;
  pTVar7 = reflection::Field::type(field);
  BVar4 = reflection::Type::base_type(pTVar7);
  if (BVar4 == Vector64) {
    OVar17 = ReadScalar<unsigned_long>(this,vector_offset);
    local_c00._M_value =
         OVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         OVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      uVar15 = 8;
      local_ca8 = (_Base_ptr)CONCAT44(local_ca8._4_4_,0xd);
      type = Vector64;
      goto LAB_0022f61b;
    }
LAB_0022f4c7:
    uVar15 = 0;
    if (vector_offset <= this->binary_length_) {
      uVar15 = this->binary_length_ - vector_offset;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_a18,"4",(allocator<char> *)&local_bc8);
    local_9f8._0_4_ = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_9f0);
    std::__cxx11::string::~string(local_a18);
    pSVar11 = reflection::Object::name(table);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regions,(char *)(pSVar11 + 1),(allocator<char> *)&union_type_vector_id);
    std::operator+(&local_b28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regions,"."
                  );
    pSVar11 = reflection::Field::name(field);
    std::operator+(&enum_type,&local_b28,(char *)(pSVar11 + 1));
    BinaryRegionComment::BinaryRegionComment(&local_4e0,(BinaryRegionComment *)local_9f8);
    anon_unknown_45::MakeBinaryRegion(&local_bc8,vector_offset,uVar15,Unknown,uVar15,0,&local_4e0);
    anon_unknown_45::MakeSingleRegionBinarySection
              ((BinarySection *)local_ca0,&enum_type,Vector,&local_bc8);
    AddSection(this,vector_offset,(BinarySection *)local_ca0);
    BinarySection::~BinarySection((BinarySection *)local_ca0);
    BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
    pBVar16 = &local_4e0;
  }
  else {
    OVar9 = ReadScalar<unsigned_int>(this,vector_offset);
    if (((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) goto LAB_0022f4c7;
    local_c00._M_value =
         (ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0xffffffff;
    uVar15 = 4;
    local_ca8 = (_Base_ptr)CONCAT44(local_ca8._4_4_,0xb);
    type = Vector;
LAB_0022f61b:
    local_cb8 = field;
    uVar8 = GetElementSize(this,field);
    offset = (char *)(uVar15 + vector_offset);
    if (offset + uVar8 * local_c00._M_value + -1 < (char *)this->binary_length_) {
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      BinaryRegionComment::BinaryRegionComment(&local_5d0,(BinaryRegionComment *)local_9f8);
      __return_storage_ptr__ = &local_bc8;
      anon_unknown_45::MakeBinaryRegion
                (__return_storage_ptr__,vector_offset,uVar15,(BinaryRegionType)local_ca8,0,0,
                 &local_5d0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&regions,__return_storage_ptr__);
      BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
      BinaryRegionComment::~BinaryRegionComment(&local_5d0);
      pTVar7 = reflection::Field::type(local_cb8);
      uVar14 = local_cb0;
      BVar4 = reflection::Type::element(pTVar7);
      local_b00 = vector_offset;
      if (BVar4 == Union) {
        uVar3 = reflection::Field::id(local_cb8);
        union_type_vector_id = uVar3 - 1;
        local_ca8 = (_Base_ptr)
                    std::
                    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                    ::find(&vtable_fields->_M_t,&union_type_vector_id);
        if ((_Rb_tree_header *)local_ca8 != &(vtable_fields->_M_t)._M_impl.super__Rb_tree_header) {
          uVar15 = uVar14 + *(ushort *)&local_ca8[1]._M_left;
          OVar5 = ReadScalar<unsigned_short>(this,uVar15);
          if (((uint)OVar5.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_short> >> 0x10 & 1) == 0) {
            uVar15 = 0;
            if (offset <= (char *)this->binary_length_) {
              uVar15 = (long)this->binary_length_ - (long)offset;
            }
            local_c98._M_p = local_c90 + 8;
            local_ca0._0_4_ = OK;
            local_c90._0_8_ = 0;
            local_c90[8] = '\0';
            local_c70._M_p = (pointer)&local_c60;
            local_c68 = (pointer)0x0;
            local_c60._M_local_buf[0] = '\0';
            local_c50._M_p = (pointer)&local_c40;
            local_c48 = 0;
            local_c40._M_local_buf[0] = '\0';
            local_c30 = 0;
            local_c78 = VectorUnionValue;
            std::__cxx11::string::string<std::allocator<char>>
                      (local_a98,"2",(allocator<char> *)&local_bc8);
            local_ca0._0_4_ = ERROR_INCOMPLETE_BINARY;
            std::__cxx11::string::_M_assign((string *)&local_c98);
            std::__cxx11::string::~string(local_a98);
            BinaryRegionComment::BinaryRegionComment(&local_738,(BinaryRegionComment *)local_ca0);
            anon_unknown_45::MakeBinaryRegion
                      (&local_bc8,(uint64_t)offset,uVar15,Unknown,uVar15,0,&local_738);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
            BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
            pBVar16 = &local_738;
LAB_0023076f:
            BinaryRegionComment::~BinaryRegionComment(pBVar16);
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_ca0);
          }
          else {
            local_cb0 = uVar15 + (ulong)((uint)OVar5.
                                               super__Optional_base<unsigned_short,_true,_true>.
                                               _M_payload.
                                               super__Optional_payload_base<unsigned_short> & 0xffff
                                        ) + 4;
            for (uVar14 = 0; local_c00._M_value != uVar14; uVar14 = uVar14 + 1) {
              local_ca0._0_4_ = OK;
              local_c98._M_p = local_c90 + 8;
              local_c90._0_8_ = 0;
              local_c90[8] = '\0';
              local_c70._M_p = (pointer)&local_c60;
              local_c68 = (pointer)0x0;
              local_c60._M_local_buf[0] = '\0';
              local_c50._M_p = (pointer)&local_c40;
              local_c48 = 0;
              local_c40._M_local_buf[0] = '\0';
              local_c78 = VectorUnionValue;
              pcVar13 = offset;
              local_c30 = uVar14;
              OVar9 = ReadScalar<unsigned_int>(this,(uint64_t)offset);
              if (((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
                uVar15 = 0;
                if (offset <= (char *)this->binary_length_) {
                  uVar15 = (long)this->binary_length_ - (long)offset;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          (local_ab8,"4",(allocator<char> *)&local_bc8);
                local_ca0._0_4_ = ERROR_INCOMPLETE_BINARY;
                std::__cxx11::string::_M_assign((string *)&local_c98);
                std::__cxx11::string::~string(local_ab8);
                BinaryRegionComment::BinaryRegionComment
                          (&local_7b0,(BinaryRegionComment *)local_ca0);
                anon_unknown_45::MakeBinaryRegion
                          (&local_bc8,(uint64_t)offset,uVar15,Unknown,uVar15,0,&local_7b0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
                BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
                pBVar16 = &local_7b0;
                goto LAB_0023076f;
              }
              pcVar10 = offset + ((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_int> &
                                 0xffffffff);
              pcVar1 = (char *)this->binary_length_;
              if (pcVar10 < pcVar1) {
                if ((pcVar1 < (char *)0x2) || (pcVar1 <= (char *)(local_cb0 + uVar14))) {
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_960,"1",(allocator<char> *)&local_bc8);
                  local_ca0._0_4_ = ERROR_INCOMPLETE_BINARY;
                  std::__cxx11::string::_M_assign((string *)&local_c98);
                  std::__cxx11::string::~string(local_960);
                  pBVar16 = &local_300;
                  BinaryRegionComment::BinaryRegionComment(pBVar16,(BinaryRegionComment *)local_ca0)
                  ;
                  anon_unknown_45::MakeBinaryRegion
                            (&local_bc8,(uint64_t)offset,0,Unknown,0,0,pBVar16);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
                  BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
                  goto LAB_0023053f;
                }
                uVar12 = (this->binary_ + local_cb0)[uVar14];
                pTVar7 = reflection::Field::type((Field *)local_ca8[1]._M_parent);
                pcVar13 = reflection::Type::index(pTVar7,pcVar13,__c_01);
                bVar2 = IsValidUnionValue(this,(uint32_t)pcVar13,uVar12);
                if (bVar2) {
                  BuildUnion_abi_cxx11_(&enum_type,this,(uint64_t)pcVar10,uVar12,local_cb8);
                  std::operator+(&local_b28,"(`",&enum_type);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_bc8,&local_b28,"`)");
                  std::__cxx11::string::operator=((string *)&local_c50,(string *)&local_bc8);
                  std::__cxx11::string::~string((string *)&local_bc8);
                  std::__cxx11::string::~string((string *)&local_b28);
                  BinaryRegionComment::BinaryRegionComment
                            (&local_378,(BinaryRegionComment *)local_ca0);
                  anon_unknown_45::MakeBinaryRegion
                            (&local_bc8,(uint64_t)offset,4,UOffset,0,(uint64_t)pcVar10,&local_378);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
                  BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
                  BinaryRegionComment::~BinaryRegionComment(&local_378);
                  offset = offset + 4;
                  std::__cxx11::string::~string((string *)&enum_type);
                }
                else {
                  offset = offset + 4;
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          (local_940,"",(allocator<char> *)&local_bc8);
                local_ca0._0_4_ = ERROR_OFFSET_OUT_OF_BINARY;
                std::__cxx11::string::_M_assign((string *)&local_c98);
                std::__cxx11::string::~string(local_940);
                pBVar16 = &local_288;
                BinaryRegionComment::BinaryRegionComment(pBVar16,(BinaryRegionComment *)local_ca0);
                anon_unknown_45::MakeBinaryRegion
                          (&local_bc8,(uint64_t)offset,4,UOffset,0,(uint64_t)pcVar10,pBVar16);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
                BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
LAB_0023053f:
                BinaryRegionComment::~BinaryRegionComment(pBVar16);
              }
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_ca0);
            }
          }
        }
      }
      else if (BVar4 == Obj) {
        this_01 = reflection::Schema::objects(this->schema_);
        pTVar7 = reflection::Field::type(local_cb8);
        pcVar13 = reflection::Type::index(pTVar7,(char *)__return_storage_ptr__,__c);
        this_02 = (_Base_ptr)
                  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                            (this_01,(uint)pcVar13);
        bVar2 = reflection::Object::is_struct((Object *)this_02);
        local_ca8 = this_02;
        if (bVar2) {
          t = 0;
          do {
            if (local_c00._M_value == t) break;
            NumToString<unsigned_long>((string *)local_ca0,t);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_bc8,"[",(string *)local_ca0);
            std::operator+(&local_8c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_bc8,"]");
            pcVar13 = (char *)BuildStruct(this,(uint64_t)offset,&regions,&local_8c0,
                                          (Object *)local_ca8);
            std::__cxx11::string::~string((string *)&local_8c0);
            std::__cxx11::string::~string((string *)&local_bc8);
            std::__cxx11::string::~string((string *)local_ca0);
            t = t + 1;
            bVar2 = pcVar13 != offset;
            offset = pcVar13;
          } while (bVar2);
        }
        else {
          local_b08 = -uVar14;
          for (uVar14 = 0; local_c00._M_value != uVar14; uVar14 = uVar14 + 1) {
            local_ca0._0_4_ = OK;
            local_c98._M_p = local_c90 + 8;
            local_c90._0_8_ = 0;
            local_c90[8] = '\0';
            local_c70._M_p = (pointer)&local_c60;
            local_c68 = (pointer)0x0;
            local_c60._M_local_buf[0] = '\0';
            local_c50._M_p = (pointer)&local_c40;
            local_c48 = 0;
            local_c40._M_local_buf[0] = '\0';
            local_c78 = VectorTableValue;
            local_c30 = uVar14;
            OVar9 = ReadScalar<unsigned_int>(this,(uint64_t)offset);
            if (((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
              uVar15 = 0;
              if (offset <= (char *)this->binary_length_) {
                uVar15 = (long)this->binary_length_ - (long)offset;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        (local_a58,"4",(allocator<char> *)&local_bc8);
              local_ca0._0_4_ = ERROR_INCOMPLETE_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_c98);
              std::__cxx11::string::~string(local_a58);
              BinaryRegionComment::BinaryRegionComment(&local_648,(BinaryRegionComment *)local_ca0);
              anon_unknown_45::MakeBinaryRegion
                        (&local_bc8,(uint64_t)offset,uVar15,Unknown,uVar15,0,&local_648);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
              BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
              pBVar16 = &local_648;
              goto LAB_0023076f;
            }
            pcVar13 = offset + ((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_int> &
                               0xffffffff);
            if (pcVar13 < (char *)this->binary_length_) {
              if (pcVar13 + local_b08 == (char *)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          (local_900,"",(allocator<char> *)&local_bc8);
                local_ca0._0_4_ = ERROR_CYCLE_DETECTED;
                std::__cxx11::string::_M_assign((string *)&local_c98);
                std::__cxx11::string::~string(local_900);
                BinaryRegionComment::BinaryRegionComment
                          (&local_8a0,(BinaryRegionComment *)local_ca0);
                anon_unknown_45::MakeBinaryRegion
                          (&local_bc8,(uint64_t)offset,4,UOffset,0,local_cb0,&local_8a0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
                BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
                BinaryRegionComment::~BinaryRegionComment(&local_8a0);
              }
              else {
                BinaryRegionComment::BinaryRegionComment
                          (&local_120,(BinaryRegionComment *)local_ca0);
                anon_unknown_45::MakeBinaryRegion
                          (&local_bc8,(uint64_t)offset,4,UOffset,0,(uint64_t)pcVar13,&local_120);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
                BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
                BinaryRegionComment::~BinaryRegionComment(&local_120);
                BuildTable(this,(uint64_t)pcVar13,Table,(Object *)local_ca8);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_8e0,"",(allocator<char> *)&local_bc8);
              local_ca0._0_4_ = ERROR_OFFSET_OUT_OF_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_c98);
              std::__cxx11::string::~string(local_8e0);
              BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_ca0);
              anon_unknown_45::MakeBinaryRegion
                        (&local_bc8,(uint64_t)offset,4,UOffset,0,(uint64_t)pcVar13,&local_a8);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
              BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
              BinaryRegionComment::~BinaryRegionComment(&local_a8);
            }
            offset = offset + 4;
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_ca0);
          }
        }
      }
      else if (BVar4 == String) {
        for (uVar14 = 0; local_c00._M_value != uVar14; uVar14 = uVar14 + 1) {
          local_ca0._0_4_ = OK;
          local_c98._M_p = local_c90 + 8;
          local_c90._0_8_ = 0;
          local_c90[8] = '\0';
          local_c70._M_p = (pointer)&local_c60;
          local_c68 = (pointer)0x0;
          local_c60._M_local_buf[0] = '\0';
          local_c50._M_p = (pointer)&local_c40;
          local_c48 = 0;
          local_c40._M_local_buf[0] = '\0';
          local_c78 = VectorStringValue;
          local_c30 = uVar14;
          OVar9 = ReadScalar<unsigned_int>(this,(uint64_t)offset);
          if (((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
            uVar15 = 0;
            if (offset <= (char *)this->binary_length_) {
              uVar15 = (long)this->binary_length_ - (long)offset;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      (local_a78,"4",(allocator<char> *)&local_bc8);
            local_ca0._0_4_ = ERROR_INCOMPLETE_BINARY;
            std::__cxx11::string::_M_assign((string *)&local_c98);
            std::__cxx11::string::~string(local_a78);
            BinaryRegionComment::BinaryRegionComment(&local_6c0,(BinaryRegionComment *)local_ca0);
            anon_unknown_45::MakeBinaryRegion
                      (&local_bc8,(uint64_t)offset,uVar15,Unknown,uVar15,0,&local_6c0);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
            BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
            pBVar16 = &local_6c0;
            goto LAB_0023076f;
          }
          pcVar13 = offset + ((ulong)OVar9.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                     .super__Optional_payload_base<unsigned_int> & 0xffffffff);
          local_cb0 = uVar14;
          if (pcVar13 < (char *)this->binary_length_) {
            BinaryRegionComment::BinaryRegionComment(&local_210,(BinaryRegionComment *)local_ca0);
            anon_unknown_45::MakeBinaryRegion
                      (&local_bc8,(uint64_t)offset,4,UOffset,0,(uint64_t)pcVar13,&local_210);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
            BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
            BinaryRegionComment::~BinaryRegionComment(&local_210);
            BuildString(this,(uint64_t)pcVar13,table,local_cb8);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_920,"",(allocator<char> *)&local_bc8);
            local_ca0._0_4_ = ERROR_OFFSET_OUT_OF_BINARY;
            std::__cxx11::string::_M_assign((string *)&local_c98);
            std::__cxx11::string::~string(local_920);
            BinaryRegionComment::BinaryRegionComment(&local_198,(BinaryRegionComment *)local_ca0);
            anon_unknown_45::MakeBinaryRegion
                      (&local_bc8,(uint64_t)offset,4,UOffset,0,(uint64_t)pcVar13,&local_198);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
            BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
            BinaryRegionComment::~BinaryRegionComment(&local_198);
          }
          uVar14 = local_cb0;
          offset = offset + 4;
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_ca0);
        }
      }
      else {
        pTVar7 = reflection::Field::type(local_cb8);
        BVar4 = reflection::Type::element(pTVar7);
        if (BVar4 - UType < 0xc) {
          pTVar7 = reflection::Field::type(local_cb8);
          BVar4 = reflection::Type::element(pTVar7);
          BVar6 = GetRegionType(BVar4);
          local_cb0 = CONCAT44(local_cb0._4_4_,BVar6);
          pTVar7 = reflection::Field::type(local_cb8);
          BVar4 = reflection::Type::element(pTVar7);
          pcVar13 = *(char **)(GetTypeSize(reflection::BaseType)::sizes + (ulong)BVar4 * 8);
          for (uVar14 = 0; local_c00._M_value != uVar14; uVar14 = uVar14 + 1) {
            local_ca0._0_4_ = OK;
            local_c98._M_p = local_c90 + 8;
            local_c90._0_8_ = 0;
            local_c90[8] = '\0';
            local_c70._M_p = (pointer)&local_c60;
            local_c68 = (pointer)0x0;
            local_c60._M_local_buf[0] = '\0';
            local_c50._M_p = (pointer)&local_c40;
            local_c48 = 0;
            local_c40._M_local_buf[0] = '\0';
            local_c78 = VectorValue;
            pcVar1 = (char *)this->binary_length_;
            local_c30 = uVar14;
            if ((pcVar1 <= pcVar13) || (pcVar1 <= pcVar13 + (long)offset + -1)) {
              uVar15 = 0;
              if (offset <= pcVar1) {
                uVar15 = (long)pcVar1 - (long)offset;
              }
              std::__cxx11::to_string(&local_ad8,(unsigned_long)pcVar13);
              local_ca0._0_4_ = ERROR_INCOMPLETE_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_c98);
              std::__cxx11::string::~string((string *)&local_ad8);
              BinaryRegionComment::BinaryRegionComment(&local_828,(BinaryRegionComment *)local_ca0);
              anon_unknown_45::MakeBinaryRegion
                        (&local_bc8,(uint64_t)offset,uVar15,Unknown,uVar15,0,&local_828);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,&local_bc8);
              BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
              pBVar16 = &local_828;
              goto LAB_0023076f;
            }
            pTVar7 = reflection::Field::type(local_cb8);
            BVar4 = reflection::Type::element(pTVar7);
            if ((BVar4 == Union) || (BVar4 == UType)) {
              pcVar1 = (char *)this->binary_length_;
              if (pcVar1 <= offset || pcVar1 < (char *)0x2) {
                uVar12 = '\0';
              }
              else {
                uVar12 = this->binary_[(long)offset];
              }
              pTVar7 = reflection::Field::type(local_cb8);
              pcVar10 = reflection::Type::index(pTVar7,(char *)__return_storage_ptr__,__c_00);
              if (pcVar1 <= offset || pcVar1 < (char *)0x2) {
                std::__throw_bad_optional_access();
              }
              bVar2 = IsValidUnionValue(this,(uint32_t)pcVar10,uVar12);
              if (bVar2) goto LAB_0022fde2;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_980,"",(allocator<char> *)&local_bc8);
              local_ca0._0_4_ = ERROR_INVALID_UNION_TYPE;
              std::__cxx11::string::_M_assign((string *)&local_c98);
              std::__cxx11::string::~string(local_980);
              BinaryRegionComment::BinaryRegionComment(&local_3f0,(BinaryRegionComment *)local_ca0);
              __return_storage_ptr__ = &local_bc8;
              anon_unknown_45::MakeBinaryRegion
                        (__return_storage_ptr__,(uint64_t)offset,(uint64_t)pcVar13,
                         (BinaryRegionType)local_cb0,0,0,&local_3f0);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,__return_storage_ptr__);
              pBVar16 = &local_3f0;
            }
            else {
LAB_0022fde2:
              BinaryRegionComment::BinaryRegionComment(&local_468,(BinaryRegionComment *)local_ca0);
              __return_storage_ptr__ = &local_bc8;
              anon_unknown_45::MakeBinaryRegion
                        (__return_storage_ptr__,(uint64_t)offset,(uint64_t)pcVar13,
                         (BinaryRegionType)local_cb0,0,0,&local_468);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,__return_storage_ptr__);
              pBVar16 = &local_468;
            }
            BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
            BinaryRegionComment::~BinaryRegionComment(pBVar16);
            offset = offset + (long)pcVar13;
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_ca0);
          }
        }
      }
      pSVar11 = reflection::Object::name(table);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b28,(char *)(pSVar11 + 1),(allocator<char> *)&union_type_vector_id
                );
      std::operator+(&enum_type,&local_b28,".");
      uVar15 = local_b00;
      pSVar11 = reflection::Field::name(local_cb8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ca0,
                     &enum_type,(char *)(pSVar11 + 1));
      local_af8.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start =
           regions.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_af8.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           regions.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_af8.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           regions.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      anon_unknown_45::MakeBinarySection
                ((BinarySection *)&local_bc8,(string *)local_ca0,type,&local_af8);
      AddSection(this,uVar15,(BinarySection *)&local_bc8);
      BinarySection::~BinarySection((BinarySection *)&local_bc8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_af8);
      std::__cxx11::string::~string((string *)local_ca0);
      std::__cxx11::string::~string((string *)&enum_type);
      std::__cxx11::string::~string((string *)&local_b28);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&regions);
      goto LAB_0023089a;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_a38,"",(allocator<char> *)&local_bc8);
    local_9f8._0_4_ = ERROR_LENGTH_TOO_LONG;
    std::__cxx11::string::_M_assign((string *)&local_9f0);
    this_00 = local_cb8;
    std::__cxx11::string::~string(local_a38);
    pSVar11 = reflection::Object::name(table);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regions,(char *)(pSVar11 + 1),(allocator<char> *)&union_type_vector_id);
    std::operator+(&local_b28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regions,"."
                  );
    pSVar11 = reflection::Field::name(this_00);
    std::operator+(&enum_type,&local_b28,(char *)(pSVar11 + 1));
    BinaryRegionComment::BinaryRegionComment(&local_558,(BinaryRegionComment *)local_9f8);
    anon_unknown_45::MakeBinaryRegion
              (&local_bc8,vector_offset,uVar15,(BinaryRegionType)local_ca8,0,0,&local_558);
    anon_unknown_45::MakeSingleRegionBinarySection
              ((BinarySection *)local_ca0,&enum_type,Vector,&local_bc8);
    AddSection(this,vector_offset,(BinarySection *)local_ca0);
    BinarySection::~BinarySection((BinarySection *)local_ca0);
    BinaryRegionComment::~BinaryRegionComment(&local_bc8.comment);
    pBVar16 = &local_558;
  }
  BinaryRegionComment::~BinaryRegionComment(pBVar16);
  std::__cxx11::string::~string((string *)&enum_type);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&regions);
LAB_0023089a:
  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_9f8);
  return;
}

Assistant:

void BinaryAnnotator::BuildVector(
    const uint64_t vector_offset, const reflection::Object *const table,
    const reflection::Field *const field, const uint64_t parent_table_offset,
    const std::map<uint16_t, VTable::Entry> vtable_fields) {
  if (ContainsSection(vector_offset)) { return; }

  BinaryRegionComment vector_length_comment;
  vector_length_comment.type = BinaryRegionCommentType::VectorLength;

  const bool is_64_bit_vector =
      field->type()->base_type() == reflection::BaseType::Vector64;

  flatbuffers::Optional<uint64_t> vector_length;
  uint32_t vector_length_size_type = 0;
  BinaryRegionType region_type = BinaryRegionType::Uint32;
  BinarySectionType section_type = BinarySectionType::Vector;

  if (is_64_bit_vector) {
    auto v = ReadScalar<uint64_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint64_t);
    region_type = BinaryRegionType::Uint64;
    section_type = BinarySectionType::Vector64;
  } else {
    auto v = ReadScalar<uint32_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint32_t);
    region_type = BinaryRegionType::Uint32;
    section_type = BinarySectionType::Vector;
  }

  if (!vector_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vector_offset);
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, remaining,
                             BinaryRegionType::Unknown, remaining, 0,
                             vector_length_comment)));
    return;
  }

  // Validate there are enough bytes left in the binary to process all the
  // items.
  const uint64_t last_item_offset =
      vector_offset + vector_length_size_type +
      vector_length.value() * GetElementSize(field);

  if (!IsValidOffset(last_item_offset - 1)) {
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, vector_length_size_type,
                             region_type, 0, 0, vector_length_comment)));

    return;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vector_offset, vector_length_size_type,
                                     region_type, 0, 0, vector_length_comment));
  // Consume the vector length offset.
  uint64_t offset = vector_offset + vector_length_size_type;

  switch (field->type()->element()) {
    case reflection::BaseType::Obj: {
      const reflection::Object *object =
          schema_->objects()->Get(field->type()->index());

      if (object->is_struct()) {
        // Vector of structs
        for (size_t i = 0; i < vector_length.value(); ++i) {
          // Structs are inline to the vector.
          const uint64_t next_offset =
              BuildStruct(offset, regions, "[" + NumToString(i) + "]", object);
          if (next_offset == offset) { break; }
          offset = next_offset;
        }
      } else {
        // Vector of objects
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_object_comment;
          vector_object_comment.type =
              BinaryRegionCommentType::VectorTableValue;
          vector_object_comment.index = i;

          const auto table_relative_offset = ReadScalar<uint32_t>(offset);
          if (!table_relative_offset.has_value()) {
            const uint64_t remaining = RemainingBytes(offset);
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_object_comment));
            break;
          }

          // The table offset is relative from the offset location itself.
          const uint64_t table_offset = offset + table_relative_offset.value();

          if (!IsValidOffset(table_offset)) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          if (table_offset == parent_table_offset) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_CYCLE_DETECTED);
            // A cycle detected where a table vector field is pointing to
            // itself. This should only happen in corrupted files.
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              table_offset, vector_object_comment));

          // Consume the offset to the table.
          offset += sizeof(uint32_t);

          BuildTable(table_offset, BinarySectionType::Table, object);
        }
      }
    } break;
    case reflection::BaseType::String: {
      // Vector of strings
      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment vector_object_comment;
        vector_object_comment.type = BinaryRegionCommentType::VectorStringValue;
        vector_object_comment.index = i;

        const auto string_relative_offset = ReadScalar<uint32_t>(offset);
        if (!string_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(
              MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, vector_object_comment));
          break;
        }

        // The string offset is relative from the offset location itself.
        const uint64_t string_offset = offset + string_relative_offset.value();

        if (!IsValidOffset(string_offset)) {
          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              string_offset, vector_object_comment));

          offset += sizeof(uint32_t);
          continue;
        }

        regions.push_back(MakeBinaryRegion(
            offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
            string_offset, vector_object_comment));

        BuildString(string_offset, table, field);

        offset += sizeof(uint32_t);
      }
    } break;
    case reflection::BaseType::Union: {
      // Vector of unions
      // Unions have both their realized type (uint8_t for now) that are
      // stored separately. These are stored in the field->index() - 1
      // location.
      const uint16_t union_type_vector_id = field->id() - 1;

      auto vtable_entry = vtable_fields.find(union_type_vector_id);
      if (vtable_entry == vtable_fields.end()) {
        // TODO(dbaileychess): need to capture this error condition.
        break;
      }

      const uint64_t union_type_vector_field_offset =
          parent_table_offset + vtable_entry->second.offset_from_table;

      const auto union_type_vector_field_relative_offset =
          ReadScalar<uint16_t>(union_type_vector_field_offset);

      if (!union_type_vector_field_relative_offset.has_value()) {
        const uint64_t remaining = RemainingBytes(offset);
        BinaryRegionComment vector_union_comment;
        vector_union_comment.type = BinaryRegionCommentType::VectorUnionValue;
        SetError(vector_union_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");

        regions.push_back(MakeBinaryRegion(offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, vector_union_comment));

        break;
      }

      // Get the offset to the first type (the + sizeof(uint32_t) is to skip
      // over the vector length which we already know). Validation happens
      // within the loop below.
      const uint64_t union_type_vector_data_offset =
          union_type_vector_field_offset +
          union_type_vector_field_relative_offset.value() + sizeof(uint32_t);

      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment comment;
        comment.type = BinaryRegionCommentType::VectorUnionValue;
        comment.index = i;

        const auto union_relative_offset = ReadScalar<uint32_t>(offset);
        if (!union_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(MakeBinaryRegion(offset, remaining,
                                             BinaryRegionType::Unknown,
                                             remaining, 0, comment));

          break;
        }

        // The union offset is relative from the offset location itself.
        const uint64_t union_offset = offset + union_relative_offset.value();

        if (!IsValidOffset(union_offset)) {
          SetError(comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

          regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                             BinaryRegionType::UOffset, 0,
                                             union_offset, comment));
          continue;
        }

        const auto realized_type =
            ReadScalar<uint8_t>(union_type_vector_data_offset + i);

        if (!realized_type.has_value()) {
          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              offset, 0, BinaryRegionType::Unknown, 0, 0, comment));
          continue;
        }

        if (!IsValidUnionValue(vtable_entry->second.field->type()->index(),
                               realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          offset += sizeof(uint32_t);
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        comment.default_value = "(`" + enum_type + "`)";
        regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                           BinaryRegionType::UOffset, 0,
                                           union_offset, comment));

        offset += sizeof(uint32_t);
      }
    } break;
    default: {
      if (IsScalar(field->type()->element())) {
        const BinaryRegionType binary_region_type =
            GetRegionType(field->type()->element());

        const uint64_t type_size = GetTypeSize(field->type()->element());

        // TODO(dbaileychess): It might be nicer to user the
        // BinaryRegion.array_length field to indicate this.
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_scalar_comment;
          vector_scalar_comment.type = BinaryRegionCommentType::VectorValue;
          vector_scalar_comment.index = i;

          if (!IsValidRead(offset, type_size)) {
            const uint64_t remaining = RemainingBytes(offset);

            SetError(vector_scalar_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                     std::to_string(type_size));

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_scalar_comment));
            break;
          }

          if (IsUnionType(field->type()->element())) {
            // This is a type for a union. Validate the value
            const auto enum_value = ReadScalar<uint8_t>(offset);

            // This should always have a value, due to the IsValidRead check
            // above.
            if (!IsValidUnionValue(field->type()->index(),
                                   enum_value.value())) {
              SetError(vector_scalar_comment,
                       BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);
              regions.push_back(MakeBinaryRegion(offset, type_size,
                                                 binary_region_type, 0, 0,
                                                 vector_scalar_comment));
              offset += type_size;
              continue;
            }
          }

          regions.push_back(MakeBinaryRegion(offset, type_size,
                                             binary_region_type, 0, 0,
                                             vector_scalar_comment));
          offset += type_size;
        }
      }
    } break;
  }
  AddSection(vector_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               section_type, std::move(regions)));
}